

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O0

void SoPlex_addRowReal(void *soplex,double *rowentries,int rowsize,int nnonzeros,double lb,double ub
                      )

{
  double dVar1;
  int in_EDX;
  long in_RSI;
  DSVectorBase<double> *in_RDI;
  LPRowBase<double> *in_stack_00000058;
  SoPlexBase<double> *in_stack_00000060;
  int i;
  DSVector row;
  SoPlex *so;
  double *in_stack_ffffffffffffff48;
  double *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  LPRowBase<double> *in_stack_ffffffffffffff60;
  undefined4 local_54;
  
  ::soplex::DSVectorBase<double>::DSVectorBase
            ((DSVectorBase<double> *)in_stack_ffffffffffffff60,
             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  for (local_54 = 0; local_54 < in_EDX; local_54 = local_54 + 1) {
    dVar1 = *(double *)(in_RSI + (long)local_54 * 8);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      ::soplex::DSVectorBase<double>::add
                ((DSVectorBase<double> *)in_stack_ffffffffffffff60,
                 (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50);
    }
  }
  ::soplex::LPRowBase<double>::LPRowBase
            (in_stack_ffffffffffffff60,(double *)0x0,(SVectorBase<double> *)in_RDI,
             in_stack_ffffffffffffff48,(double *)0x1a4879);
  ::soplex::SoPlexBase<double>::addRowReal(in_stack_00000060,in_stack_00000058);
  ::soplex::LPRowBase<double>::~LPRowBase((LPRowBase<double> *)0x1a4896);
  ::soplex::DSVectorBase<double>::~DSVectorBase(in_RDI);
  return;
}

Assistant:

void SoPlex_addRowReal(void* soplex, double* rowentries, int rowsize, int nnonzeros, double lb,
                       double ub)
{
   SoPlex* so = (SoPlex*)(soplex);
   DSVector row(nnonzeros);

   /* add nonzero entries to row vector */
   for(int i = 0; i < rowsize; ++i)
   {
      if(rowentries[i] != 0.0)
         row.add(i, rowentries[i]);
   }

   so->addRowReal(LPRow(lb, row, ub));
}